

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void object_curses_find_to_h(player *p,object *obj)

{
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t i;
  wchar_t index;
  object *obj_local;
  player *p_local;
  
  local_1c = rune_index(0,L'\x01');
  if (obj->curses != (curse_data *)0x0) {
    for (local_20 = L'\x01'; local_20 < (int)(uint)z_info->curse_max; local_20 = local_20 + L'\x01')
    {
      if (((obj->curses[local_20].power != L'\0') && (curses[local_20].obj != (object *)0x0)) &&
         ((curses[local_20].obj)->to_h != 0)) {
        player_learn_rune(p,(long)local_1c,true);
        local_1c = rune_index(5,local_20);
        if (L'\xffffffff' < local_1c) {
          player_learn_rune(p,(long)local_1c,true);
        }
      }
    }
  }
  return;
}

Assistant:

static void object_curses_find_to_h(struct player *p, struct object *obj)
{
	int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			if (curses[i].obj->to_h != 0) {
				player_learn_rune(p, index, true);

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}
}